

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void fmt::v10::detail::vformat_to<char>
               (buffer<char> *buf,basic_string_view<char> fmt,type args,locale_ref loc)

{
  undefined1 value [16];
  undefined1 value_00 [16];
  undefined1 value_01 [16];
  undefined1 value_02 [16];
  basic_string_view<char> value_03;
  basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> p_args;
  basic_string_view<char> str;
  custom_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> custom;
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  char **ppcVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_RCX;
  buffer<char> *in_RDX;
  format_handler *in_RSI;
  format_handler *in_R8;
  char *in_R9;
  format_arg arg;
  buffer_appender<char> out;
  char *p_1;
  writer write;
  char c;
  char *p;
  char *end;
  char *begin;
  buffer<char> *in_stack_fffffffffffffdb8;
  char *message;
  undefined2 in_stack_fffffffffffffdc0;
  undefined2 in_stack_fffffffffffffdc2;
  float in_stack_fffffffffffffdc4;
  default_arg_formatter<char> *in_stack_fffffffffffffdc8;
  undefined7 in_stack_fffffffffffffdd0;
  undefined7 uVar5;
  char in_stack_fffffffffffffdd7;
  undefined1 uVar6;
  undefined2 in_stack_fffffffffffffdd8;
  undefined2 in_stack_fffffffffffffdda;
  int in_stack_fffffffffffffddc;
  default_arg_formatter<char> *in_stack_fffffffffffffde0;
  default_arg_formatter<char> *in_stack_fffffffffffffde8;
  default_arg_formatter<char> *this;
  format_handler *in_stack_fffffffffffffdf0;
  locale_ref in_stack_fffffffffffffdf8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  begin_00;
  format_handler *pfVar7;
  default_arg_formatter<char> *in_stack_fffffffffffffe28;
  custom_value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> in_stack_fffffffffffffe30;
  format_handler *handler;
  buffer<char> *pbVar8;
  char *in_stack_fffffffffffffe78;
  default_arg_formatter<char> local_180;
  unsigned___int128 *local_158;
  detail *pdStack_150;
  undefined4 local_148;
  back_insert_iterator<fmt::v10::detail::buffer<char>_> local_138;
  char *local_128;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  local_120;
  format_handler *pfStack_118;
  basic_string_view<char> local_110;
  monostate local_f9 [17];
  handle local_e8;
  basic_string_view<char> local_d8;
  unsigned___int128 *local_c8;
  unsigned___int128 *local_b8;
  __int128 *local_98;
  __int128 *local_88;
  unsigned___int128 **local_60;
  default_arg_formatter<char> *local_58;
  char **local_48;
  undefined1 *local_40;
  char local_31;
  char **local_30;
  char **local_28;
  char **local_20;
  undefined1 *local_18;
  basic_string_view<char> local_10;
  
  local_128 = in_R9;
  local_120 = in_RCX;
  pfStack_118 = in_R8;
  local_110.data_ = (char *)in_RSI;
  local_110.size_ = (size_t)in_RDX;
  appender::back_insert_iterator
            ((appender *)
             CONCAT44(in_stack_fffffffffffffdc4,
                      CONCAT22(in_stack_fffffffffffffdc2,in_stack_fffffffffffffdc0)),
             in_stack_fffffffffffffdb8);
  sVar2 = basic_string_view<char>::size(&local_110);
  if (sVar2 == 2) {
    pcVar3 = basic_string_view<char>::data(&local_110);
    bVar1 = equal2(pcVar3,"{}");
    if (bVar1) {
      basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>::get
                ((basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)
                 in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
      bVar1 = basic_format_arg::operator_cast_to_bool((basic_format_arg *)&local_158);
      if (bVar1) {
        local_180.out.super_back_insert_iterator<fmt::v10::detail::buffer<char>_>.container =
             (back_insert_iterator<fmt::v10::detail::buffer<char>_>)
             (back_insert_iterator<fmt::v10::detail::buffer<char>_>)local_138.container;
        local_180.args.desc_ = (unsigned_long_long)local_120;
        local_180.args.field_1.values_ =
             (value<fmt::v10::basic_format_context<fmt::v10::appender,_char>_> *)pfStack_118;
        local_180.loc.locale_ = local_128;
        this = &local_180;
        local_60 = &local_158;
        local_58 = this;
        switch(local_148) {
        case 0:
          break;
        case 1:
          default_arg_formatter<char>::operator()
                    (in_stack_fffffffffffffdc8,(int)in_stack_fffffffffffffdc4);
          return;
        case 2:
          default_arg_formatter<char>::operator()
                    (in_stack_fffffffffffffdc8,(uint)in_stack_fffffffffffffdc4);
          return;
        case 3:
          default_arg_formatter<char>::operator()
                    (in_stack_fffffffffffffdc8,
                     CONCAT44(in_stack_fffffffffffffdc4,
                              CONCAT22(in_stack_fffffffffffffdc2,in_stack_fffffffffffffdc0)));
          return;
        case 4:
          default_arg_formatter<char>::operator()
                    (in_stack_fffffffffffffdc8,
                     CONCAT44(in_stack_fffffffffffffdc4,
                              CONCAT22(in_stack_fffffffffffffdc2,in_stack_fffffffffffffdc0)));
          return;
        case 5:
          value._8_2_ = in_stack_fffffffffffffdc0;
          value._0_8_ = in_stack_fffffffffffffdb8;
          value._10_2_ = in_stack_fffffffffffffdc2;
          value._12_4_ = in_stack_fffffffffffffdc4;
          local_98 = convert_for_visit<__int128>((__int128 *)local_158,(__int128)value);
          value_01[7] = in_stack_fffffffffffffdd7;
          value_01._0_7_ = in_stack_fffffffffffffdd0;
          value_01._8_2_ = in_stack_fffffffffffffdd8;
          value_01._10_2_ = in_stack_fffffffffffffdda;
          value_01._12_4_ = in_stack_fffffffffffffddc;
          local_88 = local_98;
          default_arg_formatter<char>::operator()(in_stack_fffffffffffffde8,(__int128)value_01);
          return;
        case 6:
          value_00._8_2_ = in_stack_fffffffffffffdc0;
          value_00._0_8_ = in_stack_fffffffffffffdb8;
          value_00._10_2_ = in_stack_fffffffffffffdc2;
          value_00._12_4_ = in_stack_fffffffffffffdc4;
          local_c8 = convert_for_visit<unsigned__int128>
                               (local_158,pdStack_150,(unsigned___int128)value_00);
          value_02[7] = in_stack_fffffffffffffdd7;
          value_02._0_7_ = in_stack_fffffffffffffdd0;
          value_02._8_2_ = in_stack_fffffffffffffdd8;
          value_02._10_2_ = in_stack_fffffffffffffdda;
          value_02._12_4_ = in_stack_fffffffffffffddc;
          local_b8 = local_c8;
          default_arg_formatter<char>::operator()(this,(unsigned___int128)value_02);
          return;
        case 7:
          default_arg_formatter<char>::operator()
                    (in_stack_fffffffffffffde0,SUB41((uint)in_stack_fffffffffffffddc >> 0x18,0));
          return;
        case 8:
          default_arg_formatter<char>::operator()
                    (in_stack_fffffffffffffdc8,(char)((uint)in_stack_fffffffffffffdc4 >> 0x18));
          return;
        case 9:
          default_arg_formatter<char>::operator()
                    (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4);
          return;
        case 10:
          default_arg_formatter<char>::operator()
                    (in_stack_fffffffffffffdc8,
                     (double)CONCAT44(in_stack_fffffffffffffdc4,
                                      CONCAT22(in_stack_fffffffffffffdc2,in_stack_fffffffffffffdc0))
                    );
          return;
        case 0xb:
          default_arg_formatter<char>::operator()
                    (in_stack_fffffffffffffde8,
                     (longdouble)
                     CONCAT28(in_stack_fffffffffffffdd8,
                              CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0)));
          return;
        case 0xc:
          default_arg_formatter<char>::operator()
                    (in_stack_fffffffffffffdc8,
                     (char *)CONCAT44(in_stack_fffffffffffffdc4,
                                      CONCAT22(in_stack_fffffffffffffdc2,in_stack_fffffffffffffdc0))
                    );
          return;
        case 0xd:
          basic_string_view<char>::basic_string_view
                    (&local_d8,(char *)local_158,(size_t)pdStack_150);
          value_03.data_._7_1_ = in_stack_fffffffffffffdd7;
          value_03.data_._0_7_ = in_stack_fffffffffffffdd0;
          value_03.size_._0_2_ = in_stack_fffffffffffffdd8;
          value_03.size_._2_2_ = in_stack_fffffffffffffdda;
          value_03.size_._4_4_ = in_stack_fffffffffffffddc;
          default_arg_formatter<char>::operator()(in_stack_fffffffffffffdc8,value_03);
          return;
        case 0xe:
          default_arg_formatter<char>::operator()
                    (in_stack_fffffffffffffde0,
                     (void *)CONCAT44(in_stack_fffffffffffffddc,
                                      CONCAT22(in_stack_fffffffffffffdda,in_stack_fffffffffffffdd8))
                    );
          return;
        case 0xf:
          custom.format =
               (_func_void_void_ptr_parse_context_ptr_basic_format_context<fmt::v10::appender,_char>_ptr
                *)pdStack_150;
          custom.value = local_158;
          basic_format_arg<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>::handle::
          handle(&local_e8,custom);
          default_arg_formatter<char>::operator()
                    (in_stack_fffffffffffffe28,(handle)in_stack_fffffffffffffe30);
          return;
        }
        uVar5 = SUB87(this,0);
        uVar6 = (undefined1)((ulong)this >> 0x38);
        monostate::monostate(local_f9);
        default_arg_formatter<char>::operator()
                  ((default_arg_formatter<char> *)CONCAT17(uVar6,uVar5));
        return;
      }
      error_handler::on_error
                ((error_handler *)
                 CONCAT44(in_stack_fffffffffffffdc4,
                          CONCAT22(in_stack_fffffffffffffdc2,in_stack_fffffffffffffdc0)),
                 (char *)in_stack_fffffffffffffdb8);
    }
  }
  str.size_ = (size_t)local_110.data_;
  str.data_ = (char *)pfStack_118;
  p_args.field_1.values_ = local_120.values_;
  p_args.desc_ = (unsigned_long_long)local_128;
  pcVar3 = local_128;
  vformat_to<char>(fmt::v10::detail::buffer<char>&,fmt::v10::basic_string_view<char>,fmt::v10::
  detail::vformat_args<char>::type,fmt::v10::detail::locale_ref)::format_handler::format_handler(fmt
  ::v10::appender,fmt::v10::basic_string_view<char>,fmt::v10::basic_format_args<fmt::v10::
  basic_format_context<fmt::v10::appender,char>>,fmt::v10::detail::locale_ref_
            (in_stack_fffffffffffffdf0,(buffer_appender<char>)local_110.size_,str,p_args,
             in_stack_fffffffffffffdf8);
  local_18 = &stack0xfffffffffffffe30;
  ppcVar4 = (char **)basic_string_view<char>::data(&local_10);
  local_20 = ppcVar4;
  sVar2 = basic_string_view<char>::size(&local_10);
  local_28 = (char **)((long)ppcVar4 + sVar2);
  if ((long)local_28 - (long)local_20 < 0x20) {
    local_30 = local_20;
    message = local_128;
    begin_00 = local_120;
    pfVar7 = pfStack_118;
    handler = (format_handler *)local_110.data_;
    pbVar8 = (buffer<char> *)local_110.size_;
    while (local_30 != local_28) {
      ppcVar4 = (char **)((long)local_30 + 1);
      local_31 = *(char *)local_30;
      local_30 = ppcVar4;
      if (local_31 == '{') {
        vformat_to<char>::format_handler::on_text(pfVar7,(char *)begin_00.values_,pcVar3);
        local_20 = (char **)parse_replacement_field<char,fmt::v10::detail::vformat_to<char>(fmt::v10::detail::buffer<char>&,fmt::v10::basic_string_view<char>,fmt::v10::detail::vformat_args<char>::type,fmt::v10::detail::locale_ref)::format_handler&>
                                      (in_stack_fffffffffffffe78,(char *)pbVar8,handler);
        local_30 = local_20;
      }
      else if (local_31 == '}') {
        if ((ppcVar4 == local_28) || (*(char *)ppcVar4 != '}')) {
          error_handler::on_error
                    ((error_handler *)
                     CONCAT44(in_stack_fffffffffffffdc4,
                              CONCAT22(in_stack_fffffffffffffdc2,in_stack_fffffffffffffdc0)),message
                    );
        }
        vformat_to<char>::format_handler::on_text(pfVar7,(char *)begin_00.values_,pcVar3);
        local_30 = (char **)((long)local_30 + 1);
        local_20 = local_30;
      }
    }
    vformat_to<char>::format_handler::on_text(pfVar7,(char *)begin_00.values_,pcVar3);
  }
  else {
    local_40 = local_18;
    pfVar7 = (format_handler *)local_110.data_;
    pbVar8 = (buffer<char> *)local_110.size_;
    while (local_20 != local_28) {
      local_48 = local_20;
      if ((*(char *)local_20 != '{') &&
         (bVar1 = find<false,char,char_const*>
                            ((char *)in_stack_fffffffffffffde0,
                             (char *)CONCAT44(in_stack_fffffffffffffddc,
                                              CONCAT22(in_stack_fffffffffffffdda,
                                                       in_stack_fffffffffffffdd8)),
                             in_stack_fffffffffffffdd7,ppcVar4), !bVar1)) {
        parse_format_string<false,_char,_format_handler>::writer::operator()
                  ((writer *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                   (char *)ppcVar4,
                   (char *)CONCAT44(in_stack_fffffffffffffdc4,
                                    CONCAT22(in_stack_fffffffffffffdc2,in_stack_fffffffffffffdc0)));
        return;
      }
      parse_format_string<false,_char,_format_handler>::writer::operator()
                ((writer *)CONCAT17(in_stack_fffffffffffffdd7,in_stack_fffffffffffffdd0),
                 (char *)ppcVar4,
                 (char *)CONCAT44(in_stack_fffffffffffffdc4,
                                  CONCAT22(in_stack_fffffffffffffdc2,in_stack_fffffffffffffdc0)));
      local_20 = (char **)parse_replacement_field<char,fmt::v10::detail::vformat_to<char>(fmt::v10::detail::buffer<char>&,fmt::v10::basic_string_view<char>,fmt::v10::detail::vformat_args<char>::type,fmt::v10::detail::locale_ref)::format_handler&>
                                    (in_stack_fffffffffffffe78,(char *)pbVar8,pfVar7);
    }
  }
  return;
}

Assistant:

void vformat_to(buffer<Char>& buf, basic_string_view<Char> fmt,
                typename vformat_args<Char>::type args, locale_ref loc) {
  auto out = buffer_appender<Char>(buf);
  if (fmt.size() == 2 && equal2(fmt.data(), "{}")) {
    auto arg = args.get(0);
    if (!arg) error_handler().on_error("argument not found");
    visit_format_arg(default_arg_formatter<Char>{out, args, loc}, arg);
    return;
  }

  struct format_handler : error_handler {
    basic_format_parse_context<Char> parse_context;
    buffer_context<Char> context;

    format_handler(buffer_appender<Char> p_out, basic_string_view<Char> str,
                   basic_format_args<buffer_context<Char>> p_args,
                   locale_ref p_loc)
        : parse_context(str), context(p_out, p_args, p_loc) {}

    void on_text(const Char* begin, const Char* end) {
      auto text = basic_string_view<Char>(begin, to_unsigned(end - begin));
      context.advance_to(write<Char>(context.out(), text));
    }

    FMT_CONSTEXPR auto on_arg_id() -> int {
      return parse_context.next_arg_id();
    }
    FMT_CONSTEXPR auto on_arg_id(int id) -> int {
      return parse_context.check_arg_id(id), id;
    }
    FMT_CONSTEXPR auto on_arg_id(basic_string_view<Char> id) -> int {
      int arg_id = context.arg_id(id);
      if (arg_id < 0) on_error("argument not found");
      return arg_id;
    }

    FMT_INLINE void on_replacement_field(int id, const Char*) {
      auto arg = get_arg(context, id);
      context.advance_to(visit_format_arg(
          default_arg_formatter<Char>{context.out(), context.args(),
                                      context.locale()},
          arg));
    }

    auto on_format_specs(int id, const Char* begin, const Char* end)
        -> const Char* {
      auto arg = get_arg(context, id);
      if (arg.type() == type::custom_type) {
        parse_context.advance_to(begin);
        visit_format_arg(custom_formatter<Char>{parse_context, context}, arg);
        return parse_context.begin();
      }
      auto specs = detail::dynamic_format_specs<Char>();
      begin = parse_format_specs(begin, end, specs, parse_context, arg.type());
      detail::handle_dynamic_spec<detail::width_checker>(
          specs.width, specs.width_ref, context);
      detail::handle_dynamic_spec<detail::precision_checker>(
          specs.precision, specs.precision_ref, context);
      if (begin == end || *begin != '}')
        on_error("missing '}' in format string");
      auto f = arg_formatter<Char>{context.out(), specs, context.locale()};
      context.advance_to(visit_format_arg(f, arg));
      return begin;
    }
  };
  detail::parse_format_string<false>(fmt, format_handler(out, fmt, args, loc));
}